

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

void nhdp_db_link_2hop_remove(nhdp_l2hop *l2hop)

{
  oonf_class_event(&_l2hop_info,l2hop,OONF_OBJECT_REMOVED);
  avl_remove(&l2hop->link->_2hop,&l2hop->_link_node);
  avl_remove(&l2hop->link->local_if->_if_twohops,&l2hop->_if_node);
  oonf_timer_stop(&l2hop->_vtime);
  oonf_class_free(&_l2hop_info,l2hop);
  return;
}

Assistant:

void
nhdp_db_link_2hop_remove(struct nhdp_l2hop *l2hop) {
  /* trigger event */
  oonf_class_event(&_l2hop_info, l2hop, OONF_OBJECT_REMOVED);

  /* remove from link tree */
  avl_remove(&l2hop->link->_2hop, &l2hop->_link_node);

  /* remove from interface tree */
  nhdp_interface_remove_l2hop(l2hop);

  /* stop validity timer */
  oonf_timer_stop(&l2hop->_vtime);

  /* free memory */
  oonf_class_free(&_l2hop_info, l2hop);
}